

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O2

void __thiscall Teleport::SharedMemoryHandle::SharedMemoryHandle(SharedMemoryHandle *this)

{
  FILE *__stream;
  int iVar1;
  int __fd;
  int iVar2;
  SharedMemory *__s;
  int *piVar3;
  char *pcVar4;
  int attempt;
  uint uVar5;
  char filename [1024];
  
  uVar5 = 0;
  do {
    if (uVar5 == 10) {
      return;
    }
    sprintf(filename,"/UnityAudioTeleport%d",(ulong)uVar5);
    iVar1 = access(filename,0);
    __fd = shm_open(filename,0x42,0x1ff);
    __stream = _stderr;
    if (__fd == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(__stream,"Open failed: %s\n",pcVar4);
    }
    else {
      iVar2 = ftruncate(__fd,0x2b1240);
      if (iVar2 == -1) {
        fwrite("ftruncate error (ignored)\n",0x1a,1,_stderr);
      }
      __s = (SharedMemory *)mmap((void *)0x0,0x2b1240,3,1,__fd,0);
      this->data = __s;
      if (__s != (SharedMemory *)0xffffffffffffffff) {
        if (iVar1 != -1) {
          return;
        }
        memset(__s,0,0x2b1240);
        return;
      }
      fwrite("mmap failed\n",0xc,1,_stderr);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

SharedMemoryHandle()
        {
            for (int attempt = 0; attempt < 10; attempt++)
            {
                bool clearmemory = true;

#if UNITY_WIN

#if !UNITY_WINRT
                char filename[1024];
                sprintf_s(filename, "UnityAudioTeleport%d", attempt);
                hMapFile = CreateFileMapping(INVALID_HANDLE_VALUE, NULL, PAGE_READWRITE, 0, sizeof(SharedMemory), filename);
#else
                wchar_t filePath[MAX_PATH];
                GetTempPathW(MAX_PATH, filePath);

                wchar_t fileName[30];
                swprintf_s(fileName, L"UnityAudioTeleport%d", attempt);

                wcscat_s(filePath, fileName);                
                hMapFile = CreateFileMappingFromApp(INVALID_HANDLE_VALUE, NULL, PAGE_READWRITE, sizeof(SharedMemory), filePath);
#endif
                if (hMapFile == NULL)
                {
                    clearmemory = false;
#if !UNITY_WINRT
                    hMapFile = OpenFileMapping(FILE_MAP_ALL_ACCESS, FALSE, filename);
#else
                    hMapFile = OpenFileMappingFromApp(FILE_MAP_ALL_ACCESS, FALSE, filePath);
#endif
                }
                if (hMapFile == NULL)
                {
                    printf("Could not create file mapping object (%d).\n", GetLastError());
                    continue;
                }

                data = (SharedMemory*)MapViewOfFile(hMapFile, FILE_MAP_ALL_ACCESS, 0, 0, sizeof(SharedMemory));
                if (data == NULL)
                {
                    printf("Could not map view of file (%d).\n", GetLastError());
                    CloseHandle(hMapFile);
                    continue;
                }

#else
                char filename[1024];

#if UNITY_LINUX
                // a shared memory object should be identified by a name of the form /somename;
                // that is, a null-terminated string of up to NAME_MAX (i.e.,  255)  characters consisting of an initial slash,
                // followed by one or more characters, none of which are slashes.
                sprintf(filename, "/UnityAudioTeleport%d", attempt);
#else
                sprintf(filename, "/tmp/UnityAudioTeleport%d", attempt);
#endif
                clearmemory = (access(filename, F_OK) == -1);
                int handle = shm_open(filename, O_RDWR | O_CREAT, 0777);
                if (handle == -1)
                {
                    fprintf(stderr, "Open failed: %s\n", strerror(errno));
                    continue;
                }

                if (ftruncate(handle, sizeof(SharedMemory)) == -1)
                {
                    fprintf(stderr, "ftruncate error (ignored)\n");
                    //continue;
                }

                data = (SharedMemory*)mmap(0, sizeof(SharedMemory), PROT_READ | PROT_WRITE, MAP_SHARED, handle, 0);
                if (data == (void*)-1)
                {
                    fprintf(stderr, "mmap failed\n");
                    continue;
                }

                //close(handle);
                //shm_unlink(filename);

#endif

                if (clearmemory)
                    memset(data, 0, sizeof(SharedMemory));

                break; // intentional (see continue's above)
            }
        }